

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitSegments.cpp
# Opt level: O2

void __thiscall wasm::LimitSegments::run(LimitSegments *this,Module *module)

{
  bool bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  Index maxDataSegments;
  string local_90;
  string local_70;
  string local_50;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"limit-segments",(allocator<char> *)&local_70);
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  maxDataSegments = 100000;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"limit-segments",&local_2a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_29);
    Pass::getArgument(&local_50,&this->super_Pass,&local_70,&local_90);
    uVar2 = std::__cxx11::stoul(&local_50,(size_t *)0x0,10);
    maxDataSegments = (Index)uVar2;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  bVar1 = MemoryUtils::ensureLimitedSegments(module,maxDataSegments);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to merge segments. ");
    poVar3 = std::operator<<(poVar3,"wasm VMs may not accept this binary");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void run(Module* module) override {
    Index maxDataSegments;
    if (hasArgument("limit-segments")) {
      maxDataSegments = std::stoul(getArgument("limit-segments", ""));
    } else {
      maxDataSegments = WebLimitations::MaxDataSegments;
    }
    if (!MemoryUtils::ensureLimitedSegments(*module, maxDataSegments)) {
      std::cerr << "Unable to merge segments. "
                << "wasm VMs may not accept this binary" << std::endl;
    }
  }